

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O2

RealType __thiscall
OpenMD::GofRTheta::evaluateAngle(GofRTheta *this,StuntDouble *sd1,StuntDouble *sd2)

{
  char cVar1;
  bool bVar2;
  ObjectType OVar3;
  double dVar4;
  Vector3d vec;
  Vector3d r12;
  MultipoleAdapter ma1;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> local_140;
  Vector<double,_3U> local_128;
  Vector<double,_3U> local_110;
  MultipoleAdapter local_f8;
  RectMatrix<double,_3U,_3U> local_f0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RotMat3x3d local_78;
  
  cVar1 = (((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  StuntDouble::getPos((Vector3d *)&local_90,sd1);
  StuntDouble::getPos((Vector3d *)&local_a8,sd2);
  operator-((Vector<double,_3U> *)&local_f0,&local_a8,&local_90);
  Vector<double,_3U>::Vector(&local_110,(Vector<double,_3U> *)&local_f0);
  if (cVar1 == '\x01') {
    Snapshot::wrapVector
              ((this->super_GofRAngle).super_RadialDistrFunc.currentSnapshot_,(Vector3d *)&local_110
              );
  }
  Vector<double,_3U>::normalize(&local_110);
  Vector<double,_3U>::Vector(&local_140);
  OVar3 = sd1->objType_;
  if (1 < OVar3 - otDAtom) {
    (*sd1->_vptr_StuntDouble[7])((string *)&local_f0,sd1);
    snprintf(painCave.errMsg,2000,"GofRTheta: attempted to use a non-directional object: %s\n",
             local_f0.data_[0][0]);
    std::__cxx11::string::~string((string *)&local_f0);
    painCave.isFatal = 1;
    simError();
    OVar3 = sd1->objType_;
  }
  if (OVar3 < otRigidBody) {
    local_f8.at_ = (AtomType *)sd1[1]._vptr_StuntDouble;
    bVar2 = MultipoleAdapter::isDipole(&local_f8);
    if (bVar2) {
      StuntDouble::getDipole((Vector3d *)&local_f0,sd1);
      Vector<double,_3U>::operator=(&local_140,(Vector<double,_3U> *)&local_f0);
    }
    else {
      StuntDouble::getA(&local_78,sd1);
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_f0,&local_78);
      operator*(&local_128,&local_f0,(Vector<double,_3U> *)OpenMD::V3Z);
      Vector3<double>::operator=((Vector3<double> *)&local_140,&local_128);
    }
  }
  else {
    StuntDouble::getA(&local_78,sd1);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_f0,&local_78);
    operator*(&local_128,&local_f0,(Vector<double,_3U> *)OpenMD::V3Z);
    Vector3<double>::operator=((Vector3<double> *)&local_140,&local_128);
  }
  Vector<double,_3U>::normalize(&local_140);
  dVar4 = dot<double,3u>(&local_110,&local_140);
  return dVar4;
}

Assistant:

RealType GofRTheta::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;

    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    r12.normalize();

    Vector3d vec;

    if (!sd1->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofRTheta: attempted to use a non-directional object: %s\n",
               sd1->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd1->isAtom()) {
      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      if (ma1.isDipole())
        vec = sd1->getDipole();
      else
        vec = sd1->getA().transpose() * V3Z;
    } else {
      vec = sd1->getA().transpose() * V3Z;
    }

    vec.normalize();

    return dot(r12, vec);
  }